

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O3

void qtree_expand(uchar *infile,uchar *a,int nx,int ny,uchar *b)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uchar *puVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  
  iVar6 = 0;
  if (0 < nx) {
    iVar6 = (ny - (ny + 1 >> 0x1f)) + 1 >> 1;
    uVar8 = nx + 1U >> 1;
    iVar9 = iVar6 * uVar8 + -1;
    iVar10 = iVar6 * 2 + (uVar8 - 1) * ny * 2 + -2;
    do {
      if (0 < ny) {
        puVar11 = a + iVar9;
        iVar7 = iVar6 + 1;
        iVar13 = iVar10;
        do {
          b[iVar13] = *puVar11;
          iVar9 = iVar9 + -1;
          puVar11 = puVar11 + -1;
          iVar13 = iVar13 + -2;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
      iVar10 = iVar10 + ny * -2;
      bVar5 = 1 < (int)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar5);
    iVar6 = 0;
    if (nx != 1) {
      iVar10 = 0;
      iVar6 = 0;
      iVar9 = ny;
      do {
        if (ny < 2) {
          iVar7 = iVar6 * ny;
          uVar8 = 0;
        }
        else {
          lVar12 = 0;
          do {
            uVar14 = (ulong)b[lVar12 + iVar10];
            if (uVar14 < 0x10) {
              uVar1 = (&DAT_00212682)[uVar14];
              uVar2 = (&DAT_00212692)[uVar14];
              uVar3 = (&DAT_002126a2)[uVar14];
              b[lVar12 + (long)iVar9 + 1] = (&DAT_00212672)[uVar14];
              b[lVar12 + iVar9] = uVar1;
              b[lVar12 + (long)iVar10 + 1] = uVar2;
              b[lVar12 + iVar10] = uVar3;
            }
            lVar12 = lVar12 + 2;
          } while ((int)lVar12 < ny + -1);
          iVar7 = (int)lVar12 + iVar10;
          uVar8 = ny & 0xfffffffe;
        }
        if ((int)uVar8 < ny) {
          b[iVar7 + ny] = b[iVar7] >> 1 & 1;
          b[iVar7] = b[iVar7] >> 3 & 1;
        }
        iVar6 = iVar6 + 2;
        iVar9 = iVar9 + ny * 2;
        iVar10 = iVar10 + ny * 2;
      } while (iVar6 < nx + -1);
    }
  }
  if (iVar6 < nx) {
    iVar6 = iVar6 * ny;
    uVar8 = 0;
    if (1 < ny) {
      lVar12 = 0;
      do {
        bVar4 = b[lVar12 + iVar6];
        b[lVar12 + (long)iVar6 + 1] = bVar4 >> 2 & 1;
        b[lVar12 + iVar6] = bVar4 >> 3 & 1;
        lVar12 = lVar12 + 2;
      } while ((int)lVar12 < ny + -1);
      uVar8 = ny & 0x7ffffffe;
      iVar6 = iVar6 + (int)lVar12;
    }
    if ((int)uVar8 < ny) {
      b[iVar6] = b[iVar6] >> 3 & 1;
    }
  }
  if (0 < ny * nx) {
    uVar14 = (ulong)(uint)(ny * nx) + 1;
    do {
      if (b[uVar14 - 2] != '\0') {
        iVar6 = input_huffman(infile);
        b[uVar14 - 2] = (uchar)iVar6;
      }
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
  }
  return;
}

Assistant:

static void
qtree_expand(unsigned char *infile, unsigned char a[], int nx, int ny, unsigned char b[])
{
int i;

	/*
	 * first copy a to b, expanding each 4-bit value
	 */
	qtree_copy(a,nx,ny,b,ny);
	/*
	 * now read new 4-bit values into b for each non-zero element
	 */
	for (i = nx*ny-1; i >= 0; i--) {
		if (b[i]) b[i] = input_huffman(infile);
	}
}